

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::
initialize<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>
          (optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>> *this,
          Animatable<tinyusdz::value::texcoord2f> *value)

{
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>)0x1) {
    *(undefined2 *)(this + 0x10) = *(undefined2 *)&value->_has_value;
    *(texcoord2f *)(this + 8) = value->_value;
    *(pointer *)(this + 0x18) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x20) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x28) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[0x30] = (optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>)(value->_ts)._dirty;
    *this = (optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::value::texcoord2f>, V = tinyusdz::Animatable<tinyusdz::value::texcoord2f>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }